

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O2

void __thiscall
TPZStructMatrixOT<double>::Serial_Assemble
          (TPZStructMatrixOT<double> *this,TPZBaseMatrix *stiff_base,TPZBaseMatrix *rhs_base,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZManVector<long,_10> *orig;
  TPZCompMesh *mesh;
  TPZCompEl *pTVar1;
  TPZGuiInterface *this_00;
  char cVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  TPZStructMatrix *this_01;
  ostream *poVar6;
  TPZCompEl **ppTVar7;
  long *plVar8;
  long *plVar9;
  TPZFMatrix<double> *rhs;
  allocator<char> local_87d1;
  TPZStructMatrixOT<double> *local_87d0;
  long local_87c8;
  long *local_87c0;
  TPZEquationFilter *local_87b8;
  long local_87b0;
  set<int,_std::less<int>,_std::allocator<int>_> *local_87a8;
  TPZFMatrix<double> *local_87a0;
  TPZFNMatrix<1000,_double> *local_8798;
  TPZFMatrix<double> *local_8790;
  TPZFMatrix<double> *local_8788;
  TPZFNMatrix<1000,_double> *local_8780;
  TPZAutoPointer<TPZGuiInterface> *local_8778;
  string local_8770;
  string local_8750;
  TPZTimer assemble;
  TPZTimer calcstiff;
  TPZElementMatrixT<double> ek;
  TPZElementMatrixT<double> ef;
  
  local_87d0 = this;
  local_8778 = guiInterface;
  lVar5 = __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  if ((lVar5 == 0) ||
     (lVar5 = __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0),
     lVar5 == 0)) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZStructMatrixOT<double>::Serial_Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TVar = double]"
                   );
    std::operator<<((ostream *)&std::cerr,": incompatible types. Aborting...\n");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/pzstrmatrixot.cpp"
               ,0xd0);
  }
  this_01 = (TPZStructMatrix *)
            __dynamic_cast(local_87d0,&typeinfo,&::TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  mesh = this_01->fMesh;
  local_87c0 = (long *)__dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,
                                      &TPZMatrix<double>::typeinfo,0);
  if ((local_87c0 == (long *)0x0) ||
     (local_8790 = (TPZFMatrix<double> *)
                   __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0)
     , local_8790 == (TPZFMatrix<double> *)0x0)) {
    __cxa_bad_cast();
  }
  if (mesh == (TPZCompMesh *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Serial_Assemble called without mesh");
    std::endl<char,std::char_traits<char>>(poVar6);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/pzstrmatrixot.cpp"
               ,0xdb);
  }
  lVar5 = (mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  TPZElementMatrixT<double>::TPZElementMatrixT(&ek,mesh,EK);
  TPZElementMatrixT<double>::TPZElementMatrixT(&ef,mesh,EF);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8750,"Computing the stiffness matrices",(allocator<char> *)&assemble);
  TPZTimer::TPZTimer(&calcstiff,&local_8750);
  std::__cxx11::string::~string((string *)&local_8750);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8770,"Assembling the stiffness matrices",&local_87d1);
  TPZTimer::TPZTimer(&assemble,&local_8770);
  local_87b8 = &this_01->fEquationFilter;
  local_87a8 = &this_01->fMaterialIds;
  std::__cxx11::string::~string((string *)&local_8770);
  orig = &ek.super_TPZElementMatrix.fSourceIndex;
  local_8780 = &ek.fConstrMat;
  local_8788 = &ef.fConstrMat.super_TPZFMatrix<double>;
  local_8798 = &ek.fMat;
  local_87a0 = &ef.fMat.super_TPZFMatrix<double>;
  local_87c8 = 0;
  if (lVar5 < 1) {
    lVar5 = 0;
  }
  for (local_87b0 = 0; lVar5 != local_87b0; local_87b0 = local_87b0 + 1) {
    ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,local_87b0);
    pTVar1 = *ppTVar7;
    if (pTVar1 != (TPZCompEl *)0x0) {
      if ((int)(this_01->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        plVar8 = (long *)(**(code **)(*(long *)pTVar1 + 0xb8))(pTVar1);
        plVar9 = (long *)__dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918)
        ;
        if (plVar8 == (long *)0x0) {
          if (plVar9 == (long *)0x0) goto LAB_011a7543;
          cVar2 = (**(code **)(*plVar9 + 0x140))(plVar9,local_87a8);
        }
        else {
          iVar4 = (**(code **)(*plVar8 + 0x58))(plVar8);
          cVar2 = ::TPZStructMatrix::ShouldCompute(this_01,iVar4);
        }
        if (cVar2 == '\0') goto LAB_011a7543;
      }
      local_87c8 = local_87c8 + 1;
      if (local_87c8 % 1000 == 0) {
        std::operator<<((ostream *)&std::cout,'*');
        std::ostream::flush();
      }
      if (local_87c8 % 20000 == 0) {
        std::operator<<((ostream *)&std::cout,"\n");
      }
      TPZTimer::start(&calcstiff);
      (**(code **)(*(long *)pTVar1 + 0x108))(pTVar1,&ek,&ef);
      if (((local_8778->fRef != (TPZReference *)0x0) &&
          (this_00 = local_8778->fRef->fPointer, this_00 != (TPZGuiInterface *)0x0)) &&
         (bVar3 = TPZGuiInterface::AmIKilled(this_00), bVar3)) break;
      TPZTimer::stop(&calcstiff);
      TPZTimer::start(&assemble);
      iVar4 = (**(code **)(*(long *)pTVar1 + 0x1f0))(pTVar1);
      if (iVar4 == 0) {
        TPZElementMatrix::ComputeDestinationIndices(&ek.super_TPZElementMatrix);
        TPZEquationFilter::Filter
                  (local_87b8,&orig->super_TPZVec<long>,
                   &ek.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
        (**(code **)(*local_87c0 + 0x1a0))
                  (local_87c0,local_8798,orig,&ek.super_TPZElementMatrix.fDestinationIndex);
        rhs = local_87a0;
        if (*(char *)((long)&(local_87d0->fElBlocked)._vptr_TPZVec +
                     *(long *)(*(long *)local_87d0 + -0x60) + 4) != '\0') goto LAB_011a7521;
      }
      else {
        TPZElementMatrixT<double>::ApplyConstraints(&ek);
        TPZElementMatrixT<double>::ApplyConstraints(&ef);
        TPZElementMatrix::ComputeDestinationIndices(&ek.super_TPZElementMatrix);
        TPZEquationFilter::Filter
                  (local_87b8,&orig->super_TPZVec<long>,
                   &ek.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
        (**(code **)(*local_87c0 + 0x1a0))
                  (local_87c0,local_8780,orig,&ek.super_TPZElementMatrix.fDestinationIndex);
        rhs = local_8788;
        if (*(char *)((long)&(local_87d0->fElBlocked)._vptr_TPZVec +
                     *(long *)(*(long *)local_87d0 + -0x60) + 4) == '\x01') {
LAB_011a7521:
          TPZFMatrix<double>::AddFel
                    (local_8790,rhs,&orig->super_TPZVec<long>,
                     &ek.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
        }
      }
      TPZTimer::stop(&assemble);
    }
LAB_011a7543:
  }
  std::__cxx11::string::~string((string *)&assemble.ProcessName);
  std::__cxx11::string::~string((string *)&calcstiff.ProcessName);
  TPZElementMatrixT<double>::~TPZElementMatrixT(&ef);
  TPZElementMatrixT<double>::~TPZElementMatrixT(&ek);
  return;
}

Assistant:

void TPZStructMatrixOT<TVar>::Serial_Assemble(TPZBaseMatrix & stiff_base, TPZBaseMatrix & rhs_base, TPZAutoPointer<TPZGuiInterface> guiInterface ){
    if(!dynamic_cast<TPZMatrix<TVar>*>(&stiff_base)||
       !dynamic_cast<TPZFMatrix<TVar>*>(&rhs_base)){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<": incompatible types. Aborting...\n";
        DebugStop();
    }
    auto *myself = dynamic_cast<TPZStructMatrix*>(this);
    auto *cmesh = myself->Mesh();
    const auto &equationFilter = myself->EquationFilter();
    auto &materialIds = myself->MaterialIds();
    
    auto &stiffness = dynamic_cast<TPZMatrix<TVar>&>(stiff_base);
    auto &rhs = dynamic_cast<TPZFMatrix<TVar>&>(rhs_base);
    if(!cmesh){
        LOGPZ_ERROR(logger,"Serial_Assemble called without mesh")
        DebugStop();
    }
#ifdef PZ_LOG
    if(dynamic_cast<TPZSubCompMesh * >(cmesh))
    {
        std::stringstream sout;
        sout << "AllEig = {};";
        LOGPZ_DEBUG(loggerelmat,sout.str())
        
    }
#endif
#ifdef PZDEBUG
    if (ComputeRhs() && rhs.Rows() != equationFilter.NActiveEquations()) {
        DebugStop();
    }
#endif
    
    int64_t iel;
    int64_t nelem = cmesh->NElements();
    TPZElementMatrixT<TVar> ek(cmesh, TPZElementMatrix::EK),ef(cmesh, TPZElementMatrix::EF);
#ifdef PZ_LOG
    bool globalresult = true;
    bool writereadresult = true;
#endif
    TPZTimer calcstiff("Computing the stiffness matrices");
    TPZTimer assemble("Assembling the stiffness matrices");
    TPZAdmChunkVector<TPZCompEl *> &elementvec = cmesh->ElementVec();
    
    int64_t count = 0;
    for(iel=0; iel < nelem; iel++) {
        TPZCompEl *el = elementvec[iel];
        if(!el) continue;
        int matidsize = materialIds.size();
        if(matidsize){
            TPZMaterial * mat = el->Material();
            TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *> (el);
            if (!mat)
            {
                if (!submesh) {
                    continue;
                }
                else if(submesh->NeedsComputing(materialIds) == false) continue;
            }
            else
            {
                int matid = mat->Id();
                if (myself->ShouldCompute(matid) == false) continue;
            }
        }
        
        count++;
        if(!(count%1000))
        {
            std::cout << '*';
            std::cout.flush();
        }
        if(!(count%20000))
        {
            std::cout << "\n";
        }
        calcstiff.start();
        
        el->CalcStiff(ek,ef);
        
        if(guiInterface) if(guiInterface->AmIKilled()){
            return;
        }
        
#ifdef PZ_LOG
        if(dynamic_cast<TPZSubCompMesh * >(cmesh))
        {
            std::stringstream objname;
            objname << "Element" << iel;
            std::string name = objname.str();
            objname << " = ";
            std::stringstream sout;
            ek.fMat.Print(objname.str().c_str(),sout,EMathematicaInput);
            sout << "AppendTo[AllEig,Eigenvalues[" << name << "]];";
            
            LOGPZ_DEBUG(loggerelmat,sout.str())
            /*		  if(iel == 133)
             {
             std::stringstream sout2;
             el->Reference()->Print(sout2);
             el->Print(sout2);
             LOGPZ_DEBUG(logger,sout2.str())
             }
             */
        }
        
#endif
        
#ifdef CHECKCONSISTENCY
        //extern TPZCheckConsistency stiffconsist("ElementStiff");
        stiffconsist.SetOverWrite(true);
        bool result;
        result = stiffconsist.CheckObject(ek.fMat);
        if(!result)
        {
            globalresult = false;
            std::stringstream sout;
            sout << "element " << iel << " computed differently";
            LOGPZ_ERROR(loggerCheck,sout.str())
        }
        
#endif
        
        calcstiff.stop();
        assemble.start();
        
        if(!el->HasDependency()) {
            ek.ComputeDestinationIndices();
            equationFilter.Filter(ek.fSourceIndex, ek.fDestinationIndex);
            //			TPZSFMatrix<TVar> test(stiffness);
            //			TPZFMatrix<TVar> test2(stiffness.Rows(),stiffness.Cols(),0.);
            //			stiffness.Print("before assembly",std::cout,EMathematicaInput);
            stiffness.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
            if(ComputeRhs())rhs.AddFel(ef.fMat,ek.fSourceIndex,ek.fDestinationIndex);
            //			stiffness.Print("stiffness after assembly STK = ",std::cout,EMathematicaInput);
            //			rhs.Print("rhs after assembly Rhs = ",std::cout,EMathematicaInput);
            //			test2.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
            //			test -= stiffness;
            //			test.Print("matriz de rigidez diference",std::cout);
            //			test2.Print("matriz de rigidez interface",std::cout);
            
#ifdef PZ_LOG
            if(loggerel.isDebugEnabled())
            {
                std::stringstream sout;
                TPZGeoEl *gel = el->Reference();
                if(gel)
                {
                    TPZManVector<REAL> center(gel->Dimension()),xcenter(3,0.);
                    gel->CenterPoint(gel->NSides()-1, center);
                    gel->X(center, xcenter);
                    sout << "Stiffness for computational element index " << el->Index() << std::endl;
                    sout << "Stiffness for geometric element " << gel->Index() << " center " << xcenter << std::endl;
                }
                else {
                    sout << "Stiffness for computational element without associated geometric element\n";
                }
                ek.Print(sout);
                if(ComputeRhs())ef.Print(sout);
                LOGPZ_DEBUG(loggerel,sout.str())
            }
#endif
        } else {
            // the element has dependent nodes
            ek.ApplyConstraints();
            ef.ApplyConstraints();
            ek.ComputeDestinationIndices();
            equationFilter.Filter(ek.fSourceIndex, ek.fDestinationIndex);
            stiffness.AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
            if(ComputeRhs())rhs.AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
#ifdef PZ_LOG
            if(loggerel.isDebugEnabled() && ! dynamic_cast<TPZSubCompMesh *>(cmesh))
            {
                std::stringstream sout;
                TPZGeoEl *gel = el->Reference();
                TPZManVector<REAL> center(gel->Dimension()),xcenter(3,0.);
                gel->CenterPoint(gel->NSides()-1, center);
                gel->X(center, xcenter);
                sout << "Stiffness for geometric element " << gel->Index() << " center " << xcenter << std::endl;
                ek.Print(sout);
                ef.Print(sout);
                LOGPZ_DEBUG(loggerel,sout.str())
            }
#endif
        }
        
        assemble.stop();
    }//fim for iel
    
#ifdef PZ_LOG
    if(loggerCheck.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "The comparaison results are : consistency check " << globalresult << " write read check " << writereadresult;
        //stiffness.Print("Matriz de Rigidez: ",sout);
        stiffness.Print("Matriz de Rigidez: ",sout,EMathematicaInput);
        if(ComputeRhs()) rhs.Print("Right Handside", sout,EMathematicaInput);
        LOGPZ_DEBUG(loggerCheck,sout.str())
    }
    
#endif
    
}